

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int bc_get_sleb128(BCReaderState *s,int32_t *pval)

{
  int iVar1;
  int32_t *in_RSI;
  long in_RDI;
  int ret;
  uint8_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  iVar1 = get_sleb128(in_RSI,(uint8_t *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  if (iVar1 < 0) {
    local_4 = bc_read_error_end((BCReaderState *)CONCAT44(iVar1,in_stack_ffffffffffffffe0));
  }
  else {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + (long)iVar1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int bc_get_sleb128(BCReaderState *s, int32_t *pval)
{
    int ret;
    ret = get_sleb128(pval, s->ptr, s->buf_end);
    if (unlikely(ret < 0))
        return bc_read_error_end(s);
    s->ptr += ret;
    return 0;
}